

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

void __thiscall wasm::WasmBinaryReader::readGlobals(WasmBinaryReader *this)

{
  char *pcVar1;
  size_t sVar2;
  uint32_t uVar3;
  ostream *poVar4;
  Expression *pEVar5;
  char *pcVar6;
  _Hash_node_base *p_Var7;
  _Head_base<0UL,_wasm::Global_*,_false> _Var8;
  Name NVar9;
  Name name;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  *in_stack_ffffffffffffff08;
  undefined1 local_f0 [8];
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  usedNames;
  __node_base local_a8 [2];
  uintptr_t local_98;
  _Head_base<0UL,_wasm::Global_*,_false> local_90;
  wasm *local_88;
  string local_80;
  pair<wasm::Name,_bool> local_60;
  char *local_48;
  _Head_base<0UL,_wasm::Global_*,_false> local_40;
  __single_object glob;
  
  glob._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
  super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl._0_4_ = getU32LEB(this);
  glob._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
  super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl._4_4_ = 0;
  pcVar6 = (char *)((long)(this->wasm->globals).
                          super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->wasm->globals).
                          super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3);
  local_f0 = (undefined1  [8])&usedNames._M_h._M_rehash_policy._M_next_resize;
  usedNames._M_h._M_buckets = (__buckets_ptr)0x1;
  usedNames._M_h._M_bucket_count = 0;
  usedNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  usedNames._M_h._M_element_count._0_4_ = 0x3f800000;
  usedNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  usedNames._M_h._M_rehash_policy._4_4_ = 0;
  usedNames._M_h._M_rehash_policy._M_next_resize = 0;
  p_Var7 = (this->globalNames)._M_h._M_before_begin._M_nxt;
  local_48 = pcVar6;
  if (p_Var7 != (_Hash_node_base *)0x0) {
    pcVar1 = pcVar6 + (long)glob._M_t.
                            super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                            .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
    do {
      if (pcVar1 <= (char *)(ulong)*(uint *)&p_Var7[1]._M_nxt) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"warning: global index out of bounds in name section: ",
                   0x35);
        NVar9.super_IString.str._M_str = pcVar6;
        NVar9.super_IString.str._M_len = (size_t)p_Var7[3]._M_nxt;
        poVar4 = wasm::operator<<((wasm *)&std::cerr,(ostream *)p_Var7[2]._M_nxt,NVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," at index ",10);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        local_60.first.super_IString.str._M_len =
             CONCAT71(local_60.first.super_IString.str._M_len._1_7_,10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_60,1);
      }
      local_60.first.super_IString.str._M_len = (size_t)local_f0;
      std::
      _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)local_f0,p_Var7 + 2,&local_60);
      p_Var7 = p_Var7->_M_nxt;
    } while (p_Var7 != (_Hash_node_base *)0x0);
  }
  if ((__uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>)
      glob._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
      super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>)0x0) {
    local_88 = (wasm *)&this->globalNames;
    _Var8._M_head_impl = (Global *)0x0;
    do {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"global$","");
      NVar9 = makeName(&local_80,(size_t)_Var8._M_head_impl);
      name.super_IString.str._M_str = local_f0;
      name.super_IString.str._M_len = (size_t)NVar9.super_IString.str._M_str;
      getOrMakeName(&local_60,local_88,
                    (unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                     *)(local_48 + (long)_Var8._M_head_impl),(Index)NVar9.super_IString.str._M_len,
                    name,in_stack_ffffffffffffff08);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      local_98 = (uintptr_t)getConcreteType(this);
      uVar3 = getU32LEB(this);
      if (1 < uVar3) {
        usedNames._M_h._M_single_bucket = local_a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&usedNames._M_h._M_single_bucket,"Global mutability must be 0 or 1","")
        ;
        throwError(this,(string *)&usedNames._M_h._M_single_bucket);
      }
      local_90._M_head_impl = _Var8._M_head_impl;
      pEVar5 = readExpression(this);
      pcVar6 = local_60.first.super_IString.str._M_str;
      sVar2 = local_60.first.super_IString.str._M_len;
      local_40._M_head_impl = (Global *)operator_new(0x50);
      (local_40._M_head_impl)->init = (Expression *)0x0;
      *(undefined8 *)&(local_40._M_head_impl)->mutable_ = 0;
      ((local_40._M_head_impl)->super_Importable).base.super_IString.str._M_str = (char *)0x0;
      ((local_40._M_head_impl)->type).id = 0;
      ((local_40._M_head_impl)->super_Importable).module.super_IString.str._M_str = (char *)0x0;
      ((local_40._M_head_impl)->super_Importable).base.super_IString.str._M_len = 0;
      *(undefined8 *)&((local_40._M_head_impl)->super_Importable).super_Named.hasExplicitName = 0;
      ((local_40._M_head_impl)->super_Importable).module.super_IString.str._M_len = 0;
      ((local_40._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len = sVar2;
      ((local_40._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_str = pcVar6
      ;
      ((local_40._M_head_impl)->type).id = local_98;
      (local_40._M_head_impl)->init = pEVar5;
      (local_40._M_head_impl)->mutable_ = uVar3 == 1;
      ((local_40._M_head_impl)->super_Importable).super_Named.hasExplicitName = local_60.second;
      Module::addGlobal(this->wasm,
                        (unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)&local_40);
      _Var8._M_head_impl = local_90._M_head_impl;
      if (local_40._M_head_impl != (Global *)0x0) {
        operator_delete(local_40._M_head_impl,0x50);
      }
      _Var8._M_head_impl =
           (Global *)
           ((long)&((_Var8._M_head_impl)->super_Importable).super_Named.name.super_IString.str.
                   _M_len + 1);
    } while (glob._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
             super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl !=
             (__uniq_ptr_data<wasm::Global,_std::default_delete<wasm::Global>,_true,_true>)
             _Var8._M_head_impl);
  }
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_f0);
  return;
}

Assistant:

void WasmBinaryReader::readGlobals() {
  size_t num = getU32LEB();
  auto numImports = wasm.globals.size();
  std::unordered_set<Name> usedNames;
  for (auto& [index, name] : globalNames) {
    if (index >= num + numImports) {
      std::cerr << "warning: global index out of bounds in name section: "
                << name << " at index " << index << '\n';
    }
    usedNames.insert(name);
  }
  for (size_t i = 0; i < num; i++) {
    auto [name, isExplicit] = getOrMakeName(
      globalNames, numImports + i, makeName("global$", i), usedNames);
    auto type = getConcreteType();
    auto mutable_ = getU32LEB();
    if (mutable_ & ~1) {
      throwError("Global mutability must be 0 or 1");
    }
    auto* init = readExpression();
    auto global = Builder::makeGlobal(
      name, type, init, mutable_ ? Builder::Mutable : Builder::Immutable);
    global->hasExplicitName = isExplicit;
    wasm.addGlobal(std::move(global));
  }
}